

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

void __thiscall
Fad<Fad<double>>::Fad<FadBinaryMul<Fad<Fad<double>>,Fad<Fad<double>>>>
          (Fad<Fad<double>> *this,
          FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *fadexpr)

{
  double *pdVar1;
  uint uVar2;
  uint uVar3;
  ulong *puVar4;
  Fad<double> *this_00;
  ulong uVar5;
  long lVar6;
  long lVar7;
  value_type local_50;
  
  FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::val
            ((value_type *)(this + 8),&fadexpr->fadexpr_);
  uVar2 = (((fadexpr->fadexpr_).left_)->dx_).num_elts;
  uVar3 = (((fadexpr->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar3 < (int)uVar2) {
    uVar3 = uVar2;
  }
  *(undefined4 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  if (0 < (int)uVar3) {
    *(uint *)(this + 0x28) = uVar3;
    lVar6 = (ulong)uVar3 * 0x20;
    puVar4 = (ulong *)operator_new__(lVar6 + 8);
    *puVar4 = (ulong)uVar3;
    lVar7 = 0;
    this_00 = (Fad<double> *)(puVar4 + 1);
    do {
      Fad<double>::Fad(this_00);
      lVar7 = lVar7 + -0x20;
      this_00 = this_00 + 1;
    } while (-lVar7 != lVar6);
    *(Fad<double> **)(this + 0x30) = (Fad<double> *)(puVar4 + 1);
  }
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined4 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  uVar2 = (((fadexpr->fadexpr_).left_)->dx_).num_elts;
  uVar3 = (((fadexpr->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar3 < (int)uVar2) {
    uVar3 = uVar2;
  }
  if (0 < (int)uVar3) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::dx
                (&local_50,&fadexpr->fadexpr_,(int)uVar5);
      lVar7 = *(long *)(this + 0x30);
      pdVar1 = (double *)(lVar7 + lVar6);
      *pdVar1 = local_50.val_;
      Vector<double>::operator=((Vector<double> *)(pdVar1 + 1),&local_50.dx_);
      *(double *)(lVar7 + 0x18 + lVar6) = local_50.defaultVal;
      Fad<double>::~Fad(&local_50);
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x20;
    } while (uVar3 != uVar5);
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }